

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void SobelYRow_C(uint8_t *src_y0,uint8_t *src_y1,uint8_t *dst_sobely,int width)

{
  uint32_t v;
  int32_t iVar1;
  int in_ECX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  long in_RSI;
  long in_RDI;
  int sobel;
  int c_diff;
  int b_diff;
  int a_diff;
  int c_sub;
  int b_sub;
  int a_sub;
  int c;
  int b;
  int a;
  int i;
  undefined4 local_20;
  
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    v = libyuv::Abs(((uint)*(byte *)(in_RDI + local_20) - (uint)*(byte *)(in_RSI + local_20)) +
                    ((uint)*(byte *)(in_RDI + (local_20 + 1)) -
                    (uint)*(byte *)(in_RSI + (local_20 + 1))) * 2 +
                    ((uint)*(byte *)(in_RDI + (local_20 + 2)) -
                    (uint)*(byte *)(in_RSI + (local_20 + 2))));
    iVar1 = libyuv::clamp255(v);
    *(char *)(CONCAT71(in_register_00000011,in_DL) + (long)local_20) = (char)iVar1;
  }
  return;
}

Assistant:

void SobelYRow_C(const uint8_t* src_y0,
                 const uint8_t* src_y1,
                 uint8_t* dst_sobely,
                 int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int a = src_y0[i + 0];
    int b = src_y0[i + 1];
    int c = src_y0[i + 2];
    int a_sub = src_y1[i + 0];
    int b_sub = src_y1[i + 1];
    int c_sub = src_y1[i + 2];
    int a_diff = a - a_sub;
    int b_diff = b - b_sub;
    int c_diff = c - c_sub;
    int sobel = Abs(a_diff + b_diff * 2 + c_diff);
    dst_sobely[i] = (uint8_t)(clamp255(sobel));
  }
}